

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  long lVar1;
  long lVar2;
  Expression *args;
  Block *args_1;
  Block *args_2;
  BranchIf *pBVar3;
  long lVar4;
  pool_ref<soul::heart::Expression> local_48;
  __fn *local_40;
  BranchIf *local_38;
  
  this_00 = this->newModule;
  args = cloneExpression(this,*(Expression **)(__fn + 0x18));
  args_1 = getRemappedBlock(this,*(Block **)(__fn + 0x20));
  args_2 = getRemappedBlock(this,*(Block **)(__fn + 0x28));
  pBVar3 = Module::
           allocate<soul::heart::BranchIf,soul::heart::Expression&,soul::heart::Block&,soul::heart::Block&>
                     (this_00,args,args_1,args_2);
  lVar1 = *(long *)(__fn + 0x30);
  lVar2 = *(long *)(__fn + 0x38);
  local_40 = __fn;
  local_38 = pBVar3;
  for (lVar4 = 0; lVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    local_48.object = cloneExpression(this,*(Expression **)(lVar1 + lVar4));
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (pBVar3->targetArgs,&local_48);
  }
  lVar1 = *(long *)(local_40 + 0x68);
  lVar2 = *(long *)(local_40 + 0x70);
  for (lVar4 = 0; lVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    local_48.object = cloneExpression(this,*(Expression **)(lVar1 + lVar4));
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (pBVar3->targetArgs + 1,&local_48);
  }
  return (int)local_38;
}

Assistant:

heart::BranchIf& clone (const heart::BranchIf& old)
    {
        auto& b =  newModule.allocate<heart::BranchIf> (cloneExpression (old.condition),
                                                        getRemappedBlock (old.targets[0]),
                                                        getRemappedBlock (old.targets[1]));

        for (auto& arg : old.targetArgs[0])
            b.targetArgs[0].push_back (cloneExpression (arg));

        for (auto& arg : old.targetArgs[1])
            b.targetArgs[1].push_back (cloneExpression (arg));

        return b;
    }